

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

PrimInfo * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx512::CurveGeometryInterface,_embree::BezierCurveT>
::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx512::CurveGeometryInterface,_embree::BezierCurveT>
          *this,PrimRef *prims,range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  undefined4 uVar2;
  uint uVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  char *pcVar5;
  size_t sVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long lVar11;
  long lVar12;
  unsigned_long uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar45;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar46;
  undefined1 auVar47 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar48;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar49;
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  size_t local_70;
  size_t local_68;
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar15 = r->_begin;
  uVar13 = r->_end;
  if (uVar15 < uVar13) {
    auVar21._8_4_ = 0xff800000;
    auVar21._0_8_ = 0xff800000ff800000;
    auVar21._12_4_ = 0xff800000;
    auVar44 = ZEXT1664(auVar21);
    auVar20._8_4_ = 0x7f800000;
    auVar20._0_8_ = 0x7f8000007f800000;
    auVar20._12_4_ = 0x7f800000;
    auVar41 = ZEXT1664(auVar20);
    local_70 = 0;
    auVar51._8_4_ = 0x7fffffff;
    auVar51._0_8_ = 0x7fffffff7fffffff;
    auVar51._12_4_ = 0x7fffffff;
    auVar52._8_4_ = 0xddccb9a2;
    auVar52._0_8_ = 0xddccb9a2ddccb9a2;
    auVar52._12_4_ = 0xddccb9a2;
    auVar53._8_4_ = 0x5dccb9a2;
    auVar53._0_8_ = 0x5dccb9a25dccb9a2;
    auVar53._12_4_ = 0x5dccb9a2;
    auVar54 = ZEXT816(0) << 0x40;
    auVar47 = ZEXT1664(auVar20);
    auVar50 = ZEXT1664(auVar21);
    local_68 = k;
    do {
      pBVar4 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
               vertices.items;
      uVar3 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                                  super_CurveGeometry.super_Geometry.field_0x58 +
                       *(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                                 super_CurveGeometry.field_0x68 * uVar15);
      uVar19 = (ulong)(uVar3 + 3);
      if (uVar19 < (pBVar4->super_RawBufferView).num) {
        lVar12 = 0;
        do {
          lVar17 = *(long *)((long)&(pBVar4->super_RawBufferView).ptr_ofs + lVar12);
          lVar18 = *(long *)((long)&(pBVar4->super_RawBufferView).stride + lVar12);
          lVar16 = lVar18 * (ulong)uVar3;
          auVar20 = vandps_avx(ZEXT416(*(uint *)(lVar17 + 0xc + lVar16)),auVar51);
          if (1.844e+18 <= auVar20._0_4_) goto LAB_01ec6750;
          lVar14 = lVar18 * (ulong)(uVar3 + 1);
          auVar20 = vandps_avx(ZEXT416(*(uint *)(lVar17 + 0xc + lVar14)),auVar51);
          if (1.844e+18 <= auVar20._0_4_) goto LAB_01ec6750;
          lVar11 = lVar18 * (ulong)(uVar3 + 2);
          auVar20 = vandps_avx(ZEXT416(*(uint *)(lVar17 + 0xc + lVar11)),auVar51);
          if (1.844e+18 <= auVar20._0_4_) goto LAB_01ec6750;
          auVar20 = vandps_avx(ZEXT416(*(uint *)(lVar17 + 0xc + lVar18 * uVar19)),auVar51);
          if (1.844e+18 <= auVar20._0_4_) goto LAB_01ec6750;
          auVar20 = *(undefined1 (*) [16])(lVar17 + lVar16);
          uVar9 = vcmpps_avx512vl(auVar20,auVar52,6);
          uVar10 = vcmpps_avx512vl(auVar20,auVar53,1);
          if ((~((ushort)uVar9 & (ushort)uVar10) & 7) != 0) goto LAB_01ec6750;
          auVar20 = *(undefined1 (*) [16])(lVar17 + lVar14);
          uVar9 = vcmpps_avx512vl(auVar20,auVar52,6);
          uVar10 = vcmpps_avx512vl(auVar20,auVar53,1);
          if ((~((ushort)uVar9 & (ushort)uVar10) & 7) != 0) goto LAB_01ec6750;
          auVar20 = *(undefined1 (*) [16])(lVar17 + lVar11);
          uVar9 = vcmpps_avx512vl(auVar20,auVar52,6);
          uVar10 = vcmpps_avx512vl(auVar20,auVar53,1);
          if ((~((ushort)uVar9 & (ushort)uVar10) & 7) != 0) goto LAB_01ec6750;
          auVar20 = *(undefined1 (*) [16])(lVar17 + lVar18 * uVar19);
          uVar9 = vcmpps_avx512vl(auVar20,auVar52,6);
          uVar10 = vcmpps_avx512vl(auVar20,auVar53,1);
          if ((~((ushort)uVar9 & (ushort)uVar10) & 7) != 0) goto LAB_01ec6750;
          lVar12 = lVar12 + 0x38;
        } while ((ulong)((this->super_CurveGeometryInterface<embree::BezierCurveT>).
                         super_CurveGeometry.super_Geometry.numTimeSteps - 1) * 0x38 + 0x38 !=
                 lVar12);
        pcVar5 = (pBVar4->super_RawBufferView).ptr_ofs;
        sVar6 = (pBVar4->super_RawBufferView).stride;
        lVar12 = uVar3 * sVar6;
        lVar18 = (uVar3 + 1) * sVar6;
        lVar17 = (uVar3 + 2) * sVar6;
        lVar16 = uVar19 * sVar6;
        fVar1 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                maxRadiusScale;
        auVar20 = vmulss_avx512f(ZEXT416((uint)fVar1),ZEXT416(*(uint *)(pcVar5 + lVar12 + 0xc)));
        auVar21 = vmulss_avx512f(ZEXT416((uint)fVar1),ZEXT416(*(uint *)(pcVar5 + lVar18 + 0xc)));
        auVar22 = vmulss_avx512f(ZEXT416((uint)fVar1),ZEXT416(*(uint *)(pcVar5 + lVar17 + 0xc)));
        auVar23 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar12)));
        auVar24 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar12 + 4)));
        auVar25 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar17)));
        auVar26 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar17 + 4)));
        auVar27 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar17 + 8)));
        auVar28 = vbroadcastss_avx512vl(auVar22);
        auVar29 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar16)));
        auVar30 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar16 + 4)));
        auVar31 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar16 + 8)));
        auVar32 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar1 * *(float *)(pcVar5 + lVar16 + 0xc))));
        auVar33 = vmulps_avx512vl(auVar29,bezier_basis0._3944_32_);
        auVar34 = vmulps_avx512vl(auVar30,bezier_basis0._3944_32_);
        auVar35 = vmulps_avx512vl(auVar31,bezier_basis0._3944_32_);
        auVar36 = vmulps_avx512vl(auVar32,bezier_basis0._3944_32_);
        auVar33 = vfmadd231ps_avx512vl(auVar33,bezier_basis0._2788_32_,auVar25);
        auVar34 = vfmadd231ps_avx512vl(auVar34,bezier_basis0._2788_32_,auVar26);
        auVar35 = vfmadd231ps_avx512vl(auVar35,bezier_basis0._2788_32_,auVar27);
        auVar36 = vfmadd231ps_avx512vl(auVar36,auVar28,bezier_basis0._2788_32_);
        auVar29 = vmulps_avx512vl(auVar29,bezier_basis0._8568_32_);
        auVar30 = vmulps_avx512vl(auVar30,bezier_basis0._8568_32_);
        auVar31 = vmulps_avx512vl(auVar31,bezier_basis0._8568_32_);
        auVar32 = vmulps_avx512vl(auVar32,bezier_basis0._8568_32_);
        auVar25 = vfmadd231ps_avx512vl(auVar29,bezier_basis0._7412_32_,auVar25);
        auVar29 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar12 + 8)));
        auVar37 = vbroadcastss_avx512vl(auVar20);
        auVar26 = vfmadd231ps_avx512vl(auVar30,bezier_basis0._7412_32_,auVar26);
        auVar30 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar18)));
        auVar27 = vfmadd231ps_avx512vl(auVar31,bezier_basis0._7412_32_,auVar27);
        auVar31 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar18 + 4)));
        auVar28 = vfmadd231ps_avx512vl(auVar32,bezier_basis0._7412_32_,auVar28);
        uVar2 = *(undefined4 *)(pcVar5 + lVar18 + 8);
        auVar38._4_4_ = uVar2;
        auVar38._0_4_ = uVar2;
        auVar38._8_4_ = uVar2;
        auVar38._12_4_ = uVar2;
        auVar38._16_4_ = uVar2;
        auVar38._20_4_ = uVar2;
        auVar38._24_4_ = uVar2;
        auVar38._28_4_ = uVar2;
        auVar32 = vbroadcastss_avx512vl(auVar21);
        auVar33 = vfmadd231ps_avx512vl(auVar33,bezier_basis0._1632_32_,auVar30);
        auVar34 = vfmadd231ps_avx512vl(auVar34,bezier_basis0._1632_32_,auVar31);
        auVar35 = vfmadd231ps_avx512vl(auVar35,bezier_basis0._1632_32_,auVar38);
        auVar36 = vfmadd231ps_avx512vl(auVar36,auVar32,bezier_basis0._1632_32_);
        auVar33 = vfmadd231ps_avx512vl(auVar33,bezier_basis0._476_32_,auVar23);
        auVar34 = vfmadd231ps_avx512vl(auVar34,bezier_basis0._476_32_,auVar24);
        auVar35 = vfmadd231ps_avx512vl(auVar35,bezier_basis0._476_32_,auVar29);
        auVar36 = vfmadd231ps_avx512vl(auVar36,auVar37,bezier_basis0._476_32_);
        auVar25 = vfmadd231ps_avx512vl(auVar25,bezier_basis0._6256_32_,auVar30);
        auVar26 = vfmadd231ps_avx512vl(auVar26,bezier_basis0._6256_32_,auVar31);
        auVar27 = vfmadd231ps_avx512vl(auVar27,bezier_basis0._6256_32_,auVar38);
        auVar28 = vfmadd231ps_avx512vl(auVar28,bezier_basis0._6256_32_,auVar32);
        auVar23 = vfmadd231ps_avx512vl(auVar25,bezier_basis0._5100_32_,auVar23);
        auVar24 = vfmadd231ps_avx512vl(auVar26,bezier_basis0._5100_32_,auVar24);
        auVar25 = vfmadd231ps_avx512vl(auVar27,bezier_basis0._5100_32_,auVar29);
        auVar26 = vfmadd231ps_avx512vl(auVar28,bezier_basis0._5100_32_,auVar37);
        auVar27._8_4_ = 0x3d638e39;
        auVar27._0_8_ = 0x3d638e393d638e39;
        auVar27._12_4_ = 0x3d638e39;
        auVar27._16_4_ = 0x3d638e39;
        auVar27._20_4_ = 0x3d638e39;
        auVar27._24_4_ = 0x3d638e39;
        auVar27._28_4_ = 0x3d638e39;
        auVar28 = vmulps_avx512vl(auVar23,auVar27);
        auVar29 = vmulps_avx512vl(auVar24,auVar27);
        auVar30 = vmulps_avx512vl(auVar25,auVar27);
        auVar31 = vmulps_avx512vl(auVar26,auVar27);
        auVar23 = vblendps_avx(auVar28,ZEXT1632(auVar54),1);
        auVar24 = vblendps_avx(auVar29,ZEXT1632(auVar54),1);
        auVar55 = ZEXT1632(auVar54);
        auVar25 = vblendps_avx(auVar30,auVar55,1);
        auVar26 = vblendps_avx(auVar31,auVar55,1);
        auVar32 = vsubps_avx512vl(auVar33,auVar23);
        auVar37 = vsubps_avx512vl(auVar34,auVar24);
        auVar38 = vsubps_avx512vl(auVar35,auVar25);
        auVar27 = vsubps_avx(auVar36,auVar26);
        auVar23 = vblendps_avx(auVar28,auVar55,0x80);
        auVar24 = vblendps_avx(auVar29,auVar55,0x80);
        auVar25 = vblendps_avx(auVar30,ZEXT1632(auVar54),0x80);
        auVar26 = vblendps_avx(auVar31,ZEXT1632(auVar54),0x80);
        auVar23 = vaddps_avx512vl(auVar33,auVar23);
        auVar24 = vaddps_avx512vl(auVar34,auVar24);
        auVar25 = vaddps_avx512vl(auVar35,auVar25);
        auVar55._0_4_ = auVar36._0_4_ + auVar26._0_4_;
        auVar55._4_4_ = auVar36._4_4_ + auVar26._4_4_;
        auVar55._8_4_ = auVar36._8_4_ + auVar26._8_4_;
        auVar55._12_4_ = auVar36._12_4_ + auVar26._12_4_;
        auVar55._16_4_ = auVar36._16_4_ + auVar26._16_4_;
        auVar55._20_4_ = auVar36._20_4_ + auVar26._20_4_;
        auVar55._24_4_ = auVar36._24_4_ + auVar26._24_4_;
        auVar55._28_4_ = auVar36._28_4_ + auVar26._28_4_;
        auVar26 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar28 = vminps_avx512vl(auVar26,auVar33);
        auVar29 = vminps_avx512vl(auVar26,auVar34);
        auVar30 = vminps_avx512vl(auVar26,auVar35);
        auVar26 = vminps_avx512vl(auVar26,auVar36);
        auVar31 = vminps_avx512vl(auVar32,auVar23);
        auVar28 = vminps_avx512vl(auVar28,auVar31);
        auVar31 = vminps_avx512vl(auVar37,auVar24);
        auVar29 = vminps_avx512vl(auVar29,auVar31);
        auVar31 = vminps_avx512vl(auVar38,auVar25);
        auVar30 = vminps_avx512vl(auVar30,auVar31);
        auVar31 = vminps_avx512vl(auVar27,auVar55);
        auVar31 = vminps_avx512vl(auVar26,auVar31);
        auVar23 = vmaxps_avx(auVar32,auVar23);
        auVar32 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar26 = vmaxps_avx512vl(auVar32,auVar33);
        auVar23 = vmaxps_avx(auVar26,auVar23);
        auVar24 = vmaxps_avx(auVar37,auVar24);
        auVar26 = vmaxps_avx512vl(auVar32,auVar34);
        auVar24 = vmaxps_avx(auVar26,auVar24);
        auVar25 = vmaxps_avx(auVar38,auVar25);
        auVar26 = vmaxps_avx512vl(auVar32,auVar35);
        auVar25 = vmaxps_avx(auVar26,auVar25);
        auVar26 = vmaxps_avx(auVar27,auVar55);
        auVar27 = vmaxps_avx512vl(auVar32,auVar36);
        auVar26 = vmaxps_avx(auVar27,auVar26);
        auVar27 = vshufps_avx512vl(auVar28,auVar28,0xb1);
        auVar28 = vminps_avx512vl(auVar28,auVar27);
        auVar27 = vshufpd_avx(auVar28,auVar28,5);
        auVar27 = vminps_avx(auVar28,auVar27);
        auVar20 = vminps_avx(auVar27._0_16_,auVar27._16_16_);
        auVar27 = vshufps_avx512vl(auVar29,auVar29,0xb1);
        auVar28 = vminps_avx512vl(auVar29,auVar27);
        auVar27 = vshufpd_avx(auVar28,auVar28,5);
        auVar27 = vminps_avx(auVar28,auVar27);
        auVar21 = vminps_avx(auVar27._0_16_,auVar27._16_16_);
        auVar21 = vunpcklps_avx(auVar20,auVar21);
        auVar27 = vshufps_avx512vl(auVar30,auVar30,0xb1);
        auVar28 = vminps_avx512vl(auVar30,auVar27);
        auVar27 = vshufpd_avx(auVar28,auVar28,5);
        auVar27 = vminps_avx(auVar28,auVar27);
        auVar20 = vminps_avx(auVar27._0_16_,auVar27._16_16_);
        auVar22 = vinsertps_avx(auVar21,auVar20,0x28);
        auVar27 = vshufps_avx(auVar23,auVar23,0xb1);
        auVar23 = vmaxps_avx(auVar23,auVar27);
        auVar27 = vshufpd_avx(auVar23,auVar23,5);
        auVar23 = vmaxps_avx(auVar23,auVar27);
        auVar20 = vmaxps_avx(auVar23._0_16_,auVar23._16_16_);
        auVar23 = vshufps_avx(auVar24,auVar24,0xb1);
        auVar23 = vmaxps_avx(auVar24,auVar23);
        auVar24 = vshufpd_avx(auVar23,auVar23,5);
        auVar23 = vmaxps_avx(auVar23,auVar24);
        auVar21 = vmaxps_avx(auVar23._0_16_,auVar23._16_16_);
        auVar21 = vunpcklps_avx(auVar20,auVar21);
        auVar23 = vshufps_avx(auVar25,auVar25,0xb1);
        auVar23 = vmaxps_avx(auVar25,auVar23);
        auVar24 = vshufpd_avx(auVar23,auVar23,5);
        auVar23 = vmaxps_avx(auVar23,auVar24);
        auVar20 = vmaxps_avx(auVar23._0_16_,auVar23._16_16_);
        auVar40 = vinsertps_avx(auVar21,auVar20,0x28);
        auVar23 = vshufps_avx512vl(auVar31,auVar31,0xb1);
        auVar24 = vminps_avx512vl(auVar31,auVar23);
        auVar23 = vshufpd_avx(auVar24,auVar24,5);
        auVar23 = vminps_avx(auVar24,auVar23);
        auVar20 = vminss_avx(auVar23._0_16_,auVar23._16_16_);
        auVar23 = vshufps_avx(auVar26,auVar26,0xb1);
        auVar23 = vmaxps_avx(auVar26,auVar23);
        auVar24 = vshufpd_avx(auVar23,auVar23,5);
        auVar23 = vmaxps_avx(auVar23,auVar24);
        auVar21 = vmaxss_avx(auVar23._0_16_,auVar23._16_16_);
        auVar56._8_4_ = 0x7fffffff;
        auVar56._0_8_ = 0x7fffffff7fffffff;
        auVar56._12_4_ = 0x7fffffff;
        auVar20 = vandps_avx(auVar56,auVar20);
        auVar21 = vandps_avx(auVar56,auVar21);
        auVar20 = vmaxss_avx(auVar21,auVar20);
        auVar42._0_4_ = auVar20._0_4_;
        auVar42._4_4_ = auVar42._0_4_;
        auVar42._8_4_ = auVar42._0_4_;
        auVar42._12_4_ = auVar42._0_4_;
        auVar22 = vsubps_avx(auVar22,auVar42);
        auVar39._0_4_ = auVar40._0_4_ + auVar42._0_4_;
        auVar39._4_4_ = auVar40._4_4_ + auVar42._0_4_;
        auVar39._8_4_ = auVar40._8_4_ + auVar42._0_4_;
        auVar39._12_4_ = auVar40._12_4_ + auVar42._0_4_;
        auVar20 = vandps_avx(auVar56,auVar22);
        auVar21 = vandps_avx(auVar56,auVar39);
        auVar20 = vmaxps_avx(auVar20,auVar21);
        auVar21 = vmovshdup_avx(auVar20);
        auVar21 = vmaxss_avx(auVar21,auVar20);
        auVar20 = vshufpd_avx(auVar20,auVar20,1);
        auVar20 = vmaxss_avx(auVar20,auVar21);
        fVar1 = auVar20._0_4_ * 4.7683716e-07;
        auVar43._4_4_ = fVar1;
        auVar43._0_4_ = fVar1;
        auVar43._8_4_ = fVar1;
        auVar43._12_4_ = fVar1;
        auVar20 = vsubps_avx(auVar22,auVar43);
        auVar22._0_4_ = auVar39._0_4_ + fVar1;
        auVar22._4_4_ = auVar39._4_4_ + fVar1;
        auVar22._8_4_ = auVar39._8_4_ + fVar1;
        auVar22._12_4_ = auVar39._12_4_ + fVar1;
        aVar7 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar22,ZEXT416((uint)uVar15),0x30);
        aVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar20,ZEXT416(geomID),0x30);
        auVar20 = vmaxps_avx512vl(auVar44._0_16_,(undefined1  [16])aVar7);
        auVar44 = ZEXT1664(auVar20);
        prims[local_68].upper.field_0.field_1 = aVar7;
        auVar40._0_4_ = aVar8.x + aVar7.x;
        auVar40._4_4_ = aVar8.y + aVar7.y;
        auVar40._8_4_ = aVar8.z + aVar7.z;
        auVar40._12_4_ = aVar8.field_3.w + aVar7.field_3.w;
        auVar20 = vminps_avx(auVar47._0_16_,auVar40);
        auVar47 = ZEXT1664(auVar20);
        auVar20 = vmaxps_avx(auVar50._0_16_,auVar40);
        auVar50 = ZEXT1664(auVar20);
        auVar20 = vminps_avx512vl(auVar41._0_16_,(undefined1  [16])aVar8);
        auVar41 = ZEXT1664(auVar20);
        prims[local_68].lower.field_0.field_1 = aVar8;
        local_70 = local_70 + 1;
        uVar13 = r->_end;
        local_68 = local_68 + 1;
      }
LAB_01ec6750:
      aVar48 = auVar50._0_16_;
      aVar45 = auVar47._0_16_;
      aVar49 = auVar44._0_16_;
      aVar46 = auVar41._0_16_;
      uVar15 = uVar15 + 1;
    } while (uVar15 < uVar13);
  }
  else {
    aVar46.m128[2] = INFINITY;
    aVar46._0_8_ = 0x7f8000007f800000;
    aVar46.m128[3] = INFINITY;
    aVar49.m128[2] = -INFINITY;
    aVar49._0_8_ = 0xff800000ff800000;
    aVar49.m128[3] = -INFINITY;
    local_70 = 0;
    aVar45 = aVar46;
    aVar48 = aVar49;
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar46;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar49;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar45;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar48;
  __return_storage_ptr__->end = local_70;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, make_range<size_t>(0, numTimeSegments()))) continue;
          const BBox3fa box = bounds(j);
          const PrimRef prim(box,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }